

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

string * __thiscall
libcellml::Units::unitAttributePrefix_abi_cxx11_
          (string *__return_storage_ptr__,Units *this,size_t index)

{
  undefined1 local_78 [8];
  string id;
  double mult;
  double exp;
  undefined1 local_40 [8];
  string ref;
  size_t index_local;
  Units *this_local;
  string *pre;
  
  ref.field_2._8_8_ = index;
  std::__cxx11::string::string((string *)local_40);
  exp._7_1_ = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::string((string *)local_78);
  unitAttributes(this,ref.field_2._8_8_,(string *)local_40,__return_storage_ptr__,&mult,
                 (double *)((long)&id.field_2 + 8),(string *)local_78);
  exp._7_1_ = 1;
  std::__cxx11::string::~string((string *)local_78);
  if ((exp._7_1_ & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string Units::unitAttributePrefix(size_t index) const
{
    std::string ref;
    std::string pre;
    double exp;
    double mult;
    std::string id;
    unitAttributes(index, ref, pre, exp, mult, id);
    return pre;
}